

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void parse_new_section(parse_state *state,int kw,int nargs,char **args)

{
  char cVar1;
  listnode *__s;
  size_t sVar2;
  ushort **ppuVar3;
  service *psVar4;
  code *pcVar5;
  listnode *plVar6;
  char *pcVar7;
  ulong uVar8;
  
  if (nargs < 2) {
    pcVar7 = "";
  }
  else {
    pcVar7 = args[1];
  }
  printf("[ %s %s ]\n",*args,pcVar7);
  if (kw == 0x15) {
    if (nargs < 2) {
      pcVar7 = "actions must have a trigger\n";
LAB_00106911:
      parse_error(state,pcVar7);
      goto LAB_00106944;
    }
    if (nargs != 2) {
      pcVar7 = "actions may not have extra parameters\n";
      goto LAB_00106911;
    }
    plVar6 = (listnode *)calloc(1,0x58);
    plVar6[3].prev = (listnode *)args[1];
    list_init(plVar6 + 4);
    list_add_tail(&action_list,plVar6);
    pcVar5 = parse_line_action;
  }
  else {
    if (kw != 0x19) {
      pcVar5 = parse_line_no_op;
      goto LAB_0010694f;
    }
    if (nargs < 3) {
      pcVar7 = "services must have a name and a program\n";
      goto LAB_00106911;
    }
    __s = (listnode *)args[1];
    sVar2 = strlen((char *)__s);
    plVar6 = __s;
    if (sVar2 < 0x11) {
      while( true ) {
        cVar1 = *(char *)&plVar6->next;
        if ((long)cVar1 == 0) break;
        ppuVar3 = __ctype_b_loc();
        if (((((*ppuVar3)[cVar1] & 8) == 0) && (cVar1 != '_')) && (cVar1 != '-')) goto LAB_00106892;
        plVar6 = (listnode *)((long)&plVar6->next + 1);
      }
      psVar4 = service_find_by_name((char *)__s);
      if (psVar4 == (service *)0x0) {
        uVar8 = (ulong)(nargs - 2U);
        plVar6 = (listnode *)calloc(1,uVar8 * 8 + 0xf0);
        if (plVar6 != (listnode *)0x0) {
          plVar6[1].next = __s;
          plVar6[1].prev = (listnode *)"default";
          memcpy(&plVar6[0xe].prev,args + 2,uVar8 * 8);
          (&plVar6[0xe].prev)[uVar8] = (listnode *)0x0;
          *(uint *)&plVar6[0xe].next = nargs - 2U;
          plVar6[0xb].next = (listnode *)"onrestart";
          list_init((listnode *)&plVar6[0xb].prev);
          list_add_tail(&service_list,plVar6);
          pcVar5 = parse_line_service;
          goto LAB_0010694b;
        }
        pcVar7 = "out of memory\n";
        goto LAB_00106911;
      }
      pcVar7 = "ignored duplicate definition of service \'%s\'\n";
    }
    else {
LAB_00106892:
      pcVar7 = "invalid service name \'%s\'\n";
    }
    parse_error(state,pcVar7,__s);
LAB_00106944:
    plVar6 = (listnode *)0x0;
    pcVar5 = parse_line_no_op;
  }
LAB_0010694b:
  state->context = plVar6;
LAB_0010694f:
  state->parse_line = pcVar5;
  return;
}

Assistant:

void parse_new_section(struct parse_state *state, int kw,
                       int nargs, char **args)
{
    printf("[ %s %s ]\n", args[0],
           nargs > 1 ? args[1] : "");
    switch(kw) {
    case K_service:
        state->context = parse_service(state, nargs, args);
        if (state->context) {
            state->parse_line = parse_line_service;
            return;
        }
        break;
    case K_on:
        state->context = parse_action(state, nargs, args);
        if (state->context) {
            state->parse_line = parse_line_action;
            return;
        }
        break;
    }
    state->parse_line = parse_line_no_op;
}